

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

SIBChunk ReadChunk(StreamReaderLE *stream)

{
  SIBChunk SVar1;
  uint32_t uVar2;
  uint uVar3;
  Logger *this;
  StreamReaderLE *stream_local;
  SIBChunk chunk;
  
  stream_local._0_4_ = Assimp::StreamReader<false,_false>::GetU4(stream);
  uVar2 = Assimp::StreamReader<false,_false>::GetU4(stream);
  stream_local._4_4_ = uVar2;
  uVar3 = Assimp::StreamReader<false,_false>::GetRemainingSizeToLimit(stream);
  if (uVar3 < uVar2) {
    this = Assimp::DefaultLogger::get();
    Assimp::Logger::error(this,"SIB: Chunk overflow");
  }
  Assimp::ByteSwap::Swap4(&stream_local);
  SVar1.Size = stream_local._4_4_;
  SVar1.Tag = (uint32_t)stream_local;
  return SVar1;
}

Assistant:

static SIBChunk ReadChunk(StreamReaderLE* stream)
{
    SIBChunk chunk;
    chunk.Tag = stream->GetU4();
    chunk.Size = stream->GetU4();
    if (chunk.Size > stream->GetRemainingSizeToLimit())
        ASSIMP_LOG_ERROR("SIB: Chunk overflow");
    ByteSwap::Swap4(&chunk.Tag);
    return chunk;
}